

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O3

void __thiscall
Glucose::OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::clean
          (OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted> *this,
          int *idx)

{
  uint uVar1;
  uint *puVar2;
  uint *puVar3;
  vec<unsigned_int> *pvVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  
  pvVar4 = (this->occs).data;
  iVar5 = pvVar4[*idx].sz;
  if (0 < iVar5) {
    pvVar4 = pvVar4 + *idx;
    puVar2 = pvVar4->data;
    puVar3 = (((this->deleted).ca)->super_RegionAllocator<unsigned_int>).memory;
    lVar7 = 0;
    iVar8 = 0;
    do {
      uVar1 = puVar2[lVar7];
      if ((puVar3[uVar1] & 3) != 1) {
        lVar6 = (long)iVar8;
        iVar8 = iVar8 + 1;
        puVar2[lVar6] = uVar1;
        iVar5 = pvVar4->sz;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar5);
    if (0 < (int)lVar7 - iVar8) {
      pvVar4->sz = (iVar5 + iVar8) - (int)lVar7;
    }
  }
  (this->dirty).data[*idx] = '\0';
  return;
}

Assistant:

void OccLists<Idx,Vec,Deleted>::clean(const Idx& idx)
{
    Vec& vec = occs[toInt(idx)];
    int  i, j;
    for (i = j = 0; i < vec.size(); i++)
        if (!deleted(vec[i]))
            vec[j++] = vec[i];
    vec.shrink(i - j);
    dirty[toInt(idx)] = 0;
}